

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * __thiscall
glcts::anon_unknown_0::BasicStdLayoutCase1CS::GetInput
          (BasicStdLayoutCase1CS *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  char *pcVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  BasicStdLayoutCase1CS *this_local;
  
  pcVar1 = GetInputC1(in_data);
  return pcVar1;
}

Assistant:

virtual const char* GetInput(std::vector<GLubyte> in_data[4])
	{
		return GetInputC1(in_data);
	}